

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbePmaReaderClear(PmaReader *pReadr)

{
  void *in_RDI;
  
  sqlite3_free((void *)0x171c92);
  sqlite3_free((void *)0x171c9f);
  if (*(long *)((long)in_RDI + 0x40) != 0) {
    sqlite3OsUnfetch((sqlite3_file *)pReadr,(i64)in_RDI,(void *)0x171cc3);
  }
  vdbeIncrFree((IncrMerger *)0x171cd0);
  memset(in_RDI,0,0x50);
  return;
}

Assistant:

static void vdbePmaReaderClear(PmaReader *pReadr){
  sqlite3_free(pReadr->aAlloc);
  sqlite3_free(pReadr->aBuffer);
  if( pReadr->aMap ) sqlite3OsUnfetch(pReadr->pFd, 0, pReadr->aMap);
  vdbeIncrFree(pReadr->pIncr);
  memset(pReadr, 0, sizeof(PmaReader));
}